

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::PluralFormat::format
          (UnicodeString *__return_storage_ptr__,PluralFormat *this,int32_t number,
          UErrorCode *status)

{
  UnicodeString *that;
  FieldPosition fpos;
  UnicodeString result;
  FieldPosition local_e8;
  UnicodeString local_d0;
  Formattable local_90;
  
  local_e8.super_UObject._vptr_UObject = (_func_int **)&PTR__FieldPosition_003b1da8;
  local_e8.fField = -1;
  local_e8.fBeginIndex = 0;
  local_e8.fEndIndex = 0;
  local_d0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003bf258;
  local_d0.fUnion.fStackFields.fLengthAndFlags = 2;
  Formattable::Formattable(&local_90,number);
  that = format(this,&local_90,(double)number,&local_d0,&local_e8,status);
  UnicodeString::UnicodeString(__return_storage_ptr__,that);
  Formattable::~Formattable(&local_90);
  UnicodeString::~UnicodeString(&local_d0);
  FieldPosition::~FieldPosition(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
PluralFormat::format(int32_t number, UErrorCode& status) const {
    FieldPosition fpos(FieldPosition::DONT_CARE);
    UnicodeString result;
    return format(Formattable(number), number, result, fpos, status);
}